

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrix.h
# Opt level: O3

float __thiscall Imath_2_5::Matrix44<float>::determinant(Matrix44<float> *this)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar1 = this->x[0][3];
  fVar8 = 0.0;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar8 = this->x[2][0];
    fVar2 = this->x[2][1];
    fVar3 = this->x[3][2];
    fVar4 = this->x[2][2];
    fVar5 = this->x[3][1];
    fVar6 = this->x[3][0];
    fVar8 = 0.0 - fVar1 * ((fVar8 * fVar5 - fVar6 * fVar2) * this->x[1][2] +
                          (fVar2 * fVar3 - fVar5 * fVar4) * this->x[1][0] +
                          (fVar4 * fVar6 - fVar3 * fVar8) * this->x[1][1]);
  }
  fVar1 = this->x[1][3];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar2 = this->x[2][0];
    fVar3 = this->x[2][1];
    fVar4 = this->x[3][2];
    fVar5 = this->x[2][2];
    fVar6 = this->x[3][1];
    fVar7 = this->x[3][0];
    fVar8 = fVar8 + fVar1 * ((fVar2 * fVar6 - fVar7 * fVar3) * this->x[0][2] +
                            (fVar3 * fVar4 - fVar6 * fVar5) * this->x[0][0] +
                            (fVar5 * fVar7 - fVar4 * fVar2) * this->x[0][1]);
  }
  fVar1 = this->x[2][3];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar2 = this->x[1][0];
    fVar3 = this->x[1][1];
    fVar4 = this->x[3][2];
    fVar5 = this->x[1][2];
    fVar6 = this->x[3][1];
    fVar7 = this->x[3][0];
    fVar8 = fVar8 - fVar1 * ((fVar2 * fVar6 - fVar7 * fVar3) * this->x[0][2] +
                            (fVar3 * fVar4 - fVar6 * fVar5) * this->x[0][0] +
                            (fVar5 * fVar7 - fVar4 * fVar2) * this->x[0][1]);
  }
  fVar1 = this->x[3][3];
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    fVar2 = this->x[1][0];
    fVar3 = this->x[1][1];
    fVar4 = this->x[2][2];
    fVar5 = this->x[1][2];
    fVar6 = this->x[2][1];
    fVar7 = this->x[2][0];
    fVar8 = fVar1 * ((fVar2 * fVar6 - fVar7 * fVar3) * this->x[0][2] +
                    (fVar3 * fVar4 - fVar6 * fVar5) * this->x[0][0] +
                    (fVar5 * fVar7 - fVar4 * fVar2) * this->x[0][1]) + fVar8;
  }
  return fVar8;
}

Assistant:

inline T
Matrix44<T>::determinant () const
{
    T sum = (T)0;

    if (x[0][3] != 0.) sum -= x[0][3] * fastMinor(1,2,3,0,1,2);
    if (x[1][3] != 0.) sum += x[1][3] * fastMinor(0,2,3,0,1,2);
    if (x[2][3] != 0.) sum -= x[2][3] * fastMinor(0,1,3,0,1,2);
    if (x[3][3] != 0.) sum += x[3][3] * fastMinor(0,1,2,0,1,2);

    return sum;
}